

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

void __thiscall spvtools::opt::Instruction::AddDebugLine(Instruction *this,Instruction *inst)

{
  IRContext *pIVar1;
  pointer pIVar2;
  uint32_t uVar3;
  NonSemanticShaderDebugInfo100Instructions NVar4;
  PodType PVar5;
  string message;
  size_type __dnew;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  spv_position_t local_48;
  
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::push_back
            (&this->dbg_line_insts_,inst);
  uVar3 = this->context_->unique_id_;
  if (uVar3 == 0xffffffff) {
    __assert_fail("unique_id_ != std::numeric_limits<uint32_t>::max()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.h"
                  ,0x1fe,"uint32_t spvtools::opt::IRContext::TakeNextUniqueId()");
  }
  uVar3 = uVar3 + 1;
  this->context_->unique_id_ = uVar3;
  (this->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_finish[-1].unique_id_ = uVar3;
  NVar4 = GetShader100DebugOpcode(inst);
  if (NVar4 - NonSemanticShaderDebugInfo100DebugLine < 2) {
    pIVar1 = this->context_;
    pIVar2 = (this->dbg_line_insts_).
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    PVar5.data._M_elems =
         (array<signed_char,_4UL>)
         Module::TakeNextIdBound
                   ((pIVar1->module_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
    if ((PVar5.data._M_elems == (_Type)0x0) &&
       ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
      local_48.line._0_4_ = (array<signed_char,_4UL>)0x25;
      local_48.line._4_4_ = (array<signed_char,_4UL>)0x0;
      local_70._0_8_ = local_70 + 0x10;
      local_70._0_8_ = std::__cxx11::string::_M_create((ulong *)local_70,(ulong)&local_48);
      local_70._16_8_ = local_48.line;
      *(undefined8 *)local_70._0_8_ = 0x667265766f204449;
      *(undefined8 *)(local_70._0_8_ + 8) = 0x797254202e776f6c;
      *(undefined8 *)(local_70._0_8_ + 0x10) = 0x676e696e6e757220;
      *(undefined8 *)(local_70._0_8_ + 0x18) = 0x746361706d6f6320;
      builtin_strncpy((char *)(local_70._0_8_ + 0x1d),"act-ids.",8);
      local_70._8_8_ = local_48.line;
      *(char *)(local_70._0_8_ + local_48.line) = '\0';
      local_48.line = 0;
      local_48.column = 0;
      local_48.index = 0;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",&local_48,(char *)local_70._0_8_);
      if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
        operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
      }
      if (pIVar2[-1].has_result_id_ != false) {
LAB_00225294:
        __assert_fail("res_id != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2cd,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
      }
    }
    else if (pIVar2[-1].has_result_id_ != false) {
      if (PVar5.data._M_elems == (_Type)0x0) goto LAB_00225294;
      local_70._24_8_ = local_70 + 0x10;
      local_70._0_8_ = &PTR__SmallVector_003d7c78;
      local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_70._16_4_ = PVar5.data._M_elems;
      local_70._8_4_ = (array<signed_char,_4UL>)0x1;
      local_70._12_4_ = (array<signed_char,_4UL>)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)(((pIVar2[-1].operands_.
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                        0xfffffffffffffffc) + (ulong)((uint)pIVar2[-1].has_type_id_ * 0x30)),
                 (SmallVector<unsigned_int,_2UL> *)local_70);
      local_70._0_8_ = &PTR__SmallVector_003d7c78;
      if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
          local_50._M_head_impl !=
          (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_50,local_50._M_head_impl);
      }
      goto LAB_002251a1;
    }
    __assert_fail("has_result_id_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
  }
LAB_002251a1:
  if ((this->context_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::AnalyzeInstDefUse
              ((this->context_->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               (this->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
  }
  return;
}

Assistant:

void Instruction::AddDebugLine(const Instruction* inst) {
  dbg_line_insts_.push_back(*inst);
  dbg_line_insts_.back().unique_id_ = context()->TakeNextUniqueId();
  if (inst->IsDebugLineInst())
    dbg_line_insts_.back().SetResultId(context_->TakeNextId());
  if (context()->AreAnalysesValid(IRContext::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(&dbg_line_insts_.back());
}